

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

lua_State * getthread(lua_State *L,int *arg)

{
  TValue *pTVar1;
  
  pTVar1 = L->base;
  if ((pTVar1 < L->top) && ((pTVar1->field_4).it >> 0xf == 0x1fff9)) {
    *arg = 1;
    return (lua_State *)(pTVar1->u64 & 0x7fffffffffff);
  }
  *arg = 0;
  return L;
}

Assistant:

static lua_State *getthread(lua_State *L, int *arg)
{
  if (L->base < L->top && tvisthread(L->base)) {
    *arg = 1;
    return threadV(L->base);
  } else {
    *arg = 0;
    return L;
  }
}